

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_groups_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  pointer pcVar1;
  size_t __n;
  string *psVar2;
  pointer pbVar3;
  int iVar4;
  pointer pbVar5;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> opts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  groups;
  stringstream out;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_270;
  long *local_258 [2];
  long local_248 [2];
  _Any_data local_238;
  code *local_228;
  code *pcStack_220;
  long *local_218;
  long local_210;
  long local_208 [2];
  string *local_1f8;
  Formatter *local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_1d0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_1f8 = __return_storage_ptr__;
  local_1f0 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  App::get_groups_abi_cxx11_(&local_1e8,app);
  pbVar3 = local_1e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_1e8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_238._M_unused._M_object = (void *)0x0;
      local_238._8_8_ = 0;
      local_228 = (code *)0x0;
      pcStack_220 = (code *)0x0;
      local_238._M_unused._M_object = operator_new(0x18);
      *(App **)local_238._M_unused._0_8_ = app;
      *(AppFormatMode *)((long)local_238._M_unused._0_8_ + 8) = mode;
      *(pointer *)((long)local_238._M_unused._0_8_ + 0x10) = pbVar5;
      pcStack_220 = std::
                    _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/cli11-src/include/CLI/Formatter.hpp:49:61)>
                    ::_M_invoke;
      local_228 = std::
                  _Function_handler<bool_(const_CLI::Option_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/cli11-src/include/CLI/Formatter.hpp:49:61)>
                  ::_M_manager;
      App::get_options(&local_270,app,(function<bool_(const_CLI::Option_*)> *)&local_238);
      if (local_228 != (code *)0x0) {
        (*local_228)(&local_238,&local_238,__destroy_functor);
      }
      if ((pbVar5->_M_string_length != 0) &&
         (local_270.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          local_270.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        local_258[0] = local_248;
        pcVar1 = (pbVar5->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,pcVar1,pcVar1 + pbVar5->_M_string_length);
        std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::vector
                  (&local_1d0,&local_270);
        (*(local_1f0->super_FormatterBase)._vptr_FormatterBase[3])
                  (&local_218,local_1f0,local_258,0,&local_1d0);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(char *)local_218,local_210);
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
        if (local_1d0.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d0.
                          super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_1d0.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1d0.
                                super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_258[0] != local_248) {
          operator_delete(local_258[0],local_248[0] + 1);
        }
        __n = pbVar5->_M_string_length;
        if (__n == local_1e8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length) {
          if (__n != 0) {
            iVar4 = bcmp((pbVar5->_M_dataplus)._M_p,
                         local_1e8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p,__n);
            if (iVar4 != 0) goto LAB_00197f9f;
          }
        }
        else {
LAB_00197f9f:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        }
      }
      if (local_270.super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_270.
                        super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_270.
                              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_270.
                              super__Vector_base<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar3);
  }
  psVar2 = local_1f8;
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

inline std::string Formatter::make_groups(const App *app, AppFormatMode mode) const {
    std::stringstream out;
    std::vector<std::string> groups = app->get_groups();

    // Options
    for(const std::string &group : groups) {
        std::vector<const Option *> opts = app->get_options([app, mode, &group](const Option *opt) {
            return opt->get_group() == group                     // Must be in the right group
                   && opt->nonpositional()                       // Must not be a positional
                   && (mode != AppFormatMode::Sub                // If mode is Sub, then
                       || (app->get_help_ptr() != opt            // Ignore help pointer
                           && app->get_help_all_ptr() != opt));  // Ignore help all pointer
        });
        if(!group.empty() && !opts.empty()) {
            out << make_group(group, false, opts);

            if(group != groups.back())
                out << "\n";
        }
    }

    return out.str();
}